

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O1

void __thiscall
LASwriteItemCompressed_BYTE14_v4::~LASwriteItemCompressed_BYTE14_v4
          (LASwriteItemCompressed_BYTE14_v4 *this)

{
  ArithmeticModel **ppAVar1;
  U8 *pUVar2;
  ArithmeticEncoder *this_00;
  ulong uVar3;
  long lVar4;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_0015f588;
  lVar4 = 0;
  do {
    if (this->contexts[lVar4].m_bytes != (ArithmeticModel **)0x0) {
      if (this->number != 0) {
        uVar3 = 0;
        do {
          ArithmeticEncoder::destroySymbolModel
                    (this->enc_Bytes[uVar3],this->contexts[lVar4].m_bytes[uVar3]);
          uVar3 = uVar3 + 1;
        } while (uVar3 < this->number);
      }
      ppAVar1 = this->contexts[lVar4].m_bytes;
      if (ppAVar1 != (ArithmeticModel **)0x0) {
        operator_delete__(ppAVar1);
      }
      pUVar2 = this->contexts[lVar4].last_item;
      if (pUVar2 != (U8 *)0x0) {
        operator_delete__(pUVar2);
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (this->outstream_Bytes != (ByteStreamOutArray **)0x0) {
    if (this->number != 0) {
      uVar3 = 0;
      do {
        if (this->outstream_Bytes[uVar3] != (ByteStreamOutArray *)0x0) {
          (*(this->outstream_Bytes[uVar3]->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
          this_00 = this->enc_Bytes[uVar3];
          if (this_00 != (ArithmeticEncoder *)0x0) {
            ArithmeticEncoder::~ArithmeticEncoder(this_00);
            operator_delete(this_00);
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->number);
    }
    if (this->outstream_Bytes != (ByteStreamOutArray **)0x0) {
      operator_delete__(this->outstream_Bytes);
    }
    if (this->enc_Bytes != (ArithmeticEncoder **)0x0) {
      operator_delete__(this->enc_Bytes);
    }
  }
  if (this->num_bytes_Bytes != (U32 *)0x0) {
    operator_delete__(this->num_bytes_Bytes);
  }
  if (this->changed_Bytes != (BOOL *)0x0) {
    operator_delete__(this->changed_Bytes);
    return;
  }
  return;
}

Assistant:

LASwriteItemCompressed_BYTE14_v4::~LASwriteItemCompressed_BYTE14_v4()
{
  /* destroy all initialized scanner channel contexts */

  U32 c, i;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_bytes)
    {
      for (i = 0; i < number; i++)
      {
        enc_Bytes[i]->destroySymbolModel(contexts[c].m_bytes[i]);
      }
      delete [] contexts[c].m_bytes;
      delete [] contexts[c].last_item;
    }
  }

  /* destroy all outstream and encoder arrays */

  if (outstream_Bytes)
  {
    for (i = 0; i < number; i++)
    {
      if (outstream_Bytes[i])
      {
        delete outstream_Bytes[i];
        delete enc_Bytes[i];
      }
    }

    delete [] outstream_Bytes;
    delete [] enc_Bytes;
  }

  /* destroy all other arrays */

  if (num_bytes_Bytes) delete [] num_bytes_Bytes;

  if (changed_Bytes) delete [] changed_Bytes;
}